

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteFoldedExprList(WatWriter *this,ExprList *exprs)

{
  bool bVar1;
  reference expr_00;
  const_iterator rhs;
  Expr *expr;
  const_iterator __end2;
  const_iterator __begin2;
  ExprList *__range2;
  ExprList *exprs_local;
  WatWriter *this_local;
  
  join_0x00000010_0x00000000_ = intrusive_list<wabt::Expr>::begin(exprs);
  rhs = intrusive_list<wabt::Expr>::end(exprs);
  while( true ) {
    bVar1 = intrusive_list<wabt::Expr>::const_iterator::operator!=
                      ((const_iterator *)&__end2.node_,rhs);
    if (!bVar1) break;
    expr_00 = intrusive_list<wabt::Expr>::const_iterator::operator*((const_iterator *)&__end2.node_)
    ;
    WriteFoldedExpr(this,expr_00);
    intrusive_list<wabt::Expr>::const_iterator::operator++((const_iterator *)&__end2.node_);
  }
  return;
}

Assistant:

void WatWriter::WriteFoldedExprList(const ExprList& exprs) {
  WABT_TRACE(WriteFoldedExprList);
  for (const Expr& expr : exprs) {
    WriteFoldedExpr(&expr);
  }
}